

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-repo.c
# Opt level: O1

int on_interest(uint8_t *interest,uint32_t interest_size,void *userdata)

{
  ndn_interest_t *interest_00;
  undefined1 local_e20 [8];
  ndn_data_t data;
  ndn_interest_t interest_pkt;
  ndn_encoder_t encoder;
  
  interest_00 = (ndn_interest_t *)(data.signature.validity_period.not_after + 9);
  ndn_interest_from_block(interest_00,interest,interest_size);
  puts("On interest: ");
  ndn_name_print((ndn_name_t *)interest_00);
  memcpy((ndn_data_t *)local_e20,interest_00,0x1bc);
  data.metainfo.final_block_id.size = 'I';
  data.metainfo.final_block_id._41_1_ = '\'';
  data.metainfo.final_block_id._42_1_ = 'm';
  data.metainfo.final_block_id._43_1_ = ' ';
  data.metainfo.content_type = 'a';
  data.metainfo.enable_ContentType = ' ';
  data.metainfo.enable_FreshnessPeriod = 'D';
  data.metainfo.enable_FinalBlockId = 'a';
  builtin_memcpy(data.content_value,"ta packet.",10);
  data.content_value[0x3f8] = '\x12';
  data.content_value[0x3f9] = '\0';
  data.content_value[0x3fa] = '\0';
  data.content_value[0x3fb] = '\0';
  data.metainfo.final_block_id.value[0x20] = '\0';
  data.metainfo.final_block_id.value[0x21] = '\x01';
  data.metainfo.final_block_id.value[0x22] = '\x01';
  data.metainfo.final_block_id.value[0x23] = '\0';
  data.name.components_size = '\x10';
  data.name._441_3_ = 0x27;
  data._444_4_ = 0;
  memset(buf,0,0x1000);
  interest_pkt.signature._648_8_ = buf;
  ndn_data_tlv_encode_digest_sign
            ((ndn_encoder_t *)(interest_pkt.signature.validity_period.not_after + 9),
             (ndn_data_t *)local_e20);
  ndn_forwarder_put_data((uint8_t *)interest_pkt.signature._648_8_,0);
  return 0;
}

Assistant:

int
on_interest(const uint8_t* interest, uint32_t interest_size, void* userdata)
{
  ndn_interest_t interest_pkt;
  ndn_interest_from_block(&interest_pkt, interest, interest_size);
  ndn_data_t data;
  ndn_encoder_t encoder;
  char * str = "I'm a Data packet.";

  printf("On interest: \n");
  ndn_name_print(&interest_pkt.name);
  data.name = interest_pkt.name;
  ndn_data_set_content(&data, (uint8_t*)str, strlen(str));
  ndn_metainfo_init(&data.metainfo);
  ndn_metainfo_set_content_type(&data.metainfo, NDN_CONTENT_TYPE_BLOB);
  ndn_metainfo_set_freshness_period(&data.metainfo, 10000);
  encoder_init(&encoder, buf, 4096);
  ndn_data_tlv_encode_digest_sign(&encoder, &data);
  ndn_forwarder_put_data(encoder.output_value, encoder.offset);

  return NDN_FWD_STRATEGY_SUPPRESS;
}